

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void base64_encode_binary(uchar *in,char *out,int len)

{
  uchar uVar1;
  int iVar2;
  uchar *__ptr;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  unsigned_long olen;
  size_t local_38;
  
  uVar8 = (ulong)len;
  local_38 = compressBound(uVar8);
  __ptr = (uchar *)malloc(local_38);
  iVar2 = compress2(__ptr,&local_38,in,uVar8,9);
  if (iVar2 != 0) {
    panic("Could not compress input data!");
  }
  uVar5 = 0;
  iVar2 = sprintf(out,"$%d$",(ulong)(uint)len);
  puVar6 = __ptr;
  if (uVar8 <= (long)iVar2 + local_38) {
    iVar2 = 0;
    puVar6 = in;
    local_38 = uVar8;
  }
  uVar8 = (local_38 / 3) * 3;
  if (uVar8 == 0) {
    uVar3 = 0;
  }
  else {
    puVar7 = (uchar *)(out + (long)iVar2 + 3);
    uVar3 = 0;
    do {
      puVar7[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [puVar6[uVar3] >> 2];
      puVar7[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(puVar6[uVar3 + 1] >> 4) | (puVar6[uVar3] & 3) << 4];
      puVar7[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(puVar6[uVar3 + 2] >> 6) + (puVar6[uVar3 + 1] & 0xf) * 4];
      *puVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [puVar6[uVar3 + 2] & 0x3f];
      uVar3 = uVar3 + 3;
      puVar7 = puVar7 + 4;
      iVar2 = iVar2 + 4;
    } while (uVar3 < uVar8);
    uVar5 = (uint)uVar3;
  }
  iVar4 = (int)local_38 - uVar5;
  if (0 < iVar4) {
    out[iVar2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [puVar6[uVar3] >> 2];
    uVar8 = (ulong)((puVar6[uVar3] & 3) << 4);
    if (iVar4 == 1) {
      out[(long)iVar2 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
      uVar1 = '=';
    }
    else {
      out[(long)iVar2 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [puVar6[(ulong)uVar5 + 1] >> 4 | uVar8];
      uVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(puVar6[(ulong)uVar5 + 1] & 0xf) * 4];
    }
    out[(long)iVar2 + 2] = uVar1;
    out[(long)iVar2 + 3] = '=';
    iVar2 = iVar2 + 4;
  }
  free(__ptr);
  out[iVar2] = '\0';
  return;
}

Assistant:

static void base64_encode_binary(const unsigned char* in, char *out, int len)
{
    int i, pos, rem;
    unsigned long olen = compressBound(len);
    unsigned char *o = malloc(olen);

    if (compress2(o, &olen, in, len, Z_BEST_COMPRESSION) != Z_OK)
	panic("Could not compress input data!");

    pos = sprintf(out, "$%d$", len);
    if (pos + olen >= len) {
	pos = 0;
	olen = len;
    } else {
	in = o;
    }

    for (i = 0; i < (olen / 3) * 3; i += 3) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 | (in[i+1] & 0xf0) >> 4];
	out[pos+2] = b64e[(in[i+1] & 0x0f) << 2 | (in[i+2] & 0xc0) >> 6];
	out[pos+3] = b64e[ in[i+2] & 0x3f];
	pos += 4;
    }

    rem = olen - i;
    if (rem > 0) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 |
			 (rem == 1 ? 0 :
			  (in[i+1] & 0xf0) >> 4)];
	out[pos+2] = (rem == 1) ? '=' :
		     b64e[(in[i+1] & 0x0f) << 2];
	out[pos+3] = '=';
	pos += 4;
    }

    free(o);

    out[pos] = '\0';
}